

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colVector.c
# Opt level: O0

void Col_MVectorSetLength(Col_Word mvector,size_t length)

{
  ulong uVar1;
  uint local_34;
  uint local_30;
  uint local_2c;
  size_t oldLength;
  size_t capacity;
  size_t length_local;
  Col_Word mvector_local;
  
  if (mvector == 0) {
    local_2c = 0;
  }
  else {
    if ((mvector & 0xf) == 0) {
      if ((*(byte *)mvector & 2) == 0) {
        local_34 = 0xffffffff;
      }
      else {
        local_34 = *(byte *)mvector & 0xfffffffe;
      }
      local_30 = local_34;
    }
    else {
      local_30 = immediateWordTypes[mvector & 0x1f];
    }
    local_2c = local_30;
  }
  length_local = mvector;
  if ((local_2c == 2) && ((*(ushort *)(mvector + 2) & 0xc) == 0)) {
    length_local = *(size_t *)(mvector + 0x10);
  }
  uVar1 = (*(ulong *)length_local >> 8) * 0x20 - 0x10 >> 3;
  if (uVar1 < length) {
    Col_Error(COL_VALUECHECK,ColibriDomain,0x12,length,uVar1);
  }
  else {
    uVar1 = *(ulong *)(length_local + 8);
    if (uVar1 < length) {
      memset((void *)(length_local + 0x10 + uVar1 * 8),0,(length - uVar1) * 8);
    }
    *(size_t *)(length_local + 8) = length;
  }
  return;
}

Assistant:

void
Col_MVectorSetLength(
    Col_Word mvector,   /*!< Mutable vector to resize. */
    size_t length)      /*!< New length. Must not exceed capacity set at
                             creation time. */
{
    size_t capacity, oldLength;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MVECTOR,mvector} */
    TYPECHECK_MVECTOR(mvector) return;

    WORD_UNWRAP(mvector);

    /*! @valuecheck{COL_ERROR_VECTORLENGTH,length < [Col_MVectorCapacity(mvector)](@ref Col_MVectorCapacity).} */
    capacity = VECTOR_MAX_LENGTH(WORD_MVECTOR_SIZE(mvector) * CELL_SIZE);
    VALUECHECK_VECTORLENGTH(length, capacity) return;

    oldLength = WORD_VECTOR_LENGTH(mvector);
    if (length > oldLength) {
        /*
         * Initialize elements to nil.
         */

        memset(WORD_VECTOR_ELEMENTS(mvector) + oldLength, 0, (length
                - oldLength)*sizeof(Col_Word));
    }
    WORD_VECTOR_LENGTH(mvector) = length;
}